

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3TruncateNode(char *aNode,int nNode,Blob *pNew,char *zTerm,int nTerm,sqlite3_int64 *piBlock)

{
  char cVar1;
  int iVar2;
  int res;
  int bLeaf;
  int rc;
  Blob prev;
  NodeReader reader;
  sqlite3_int64 *piBlock_local;
  int nTerm_local;
  char *zTerm_local;
  Blob *pNew_local;
  int nNode_local;
  char *aNode_local;
  
  memset(&bLeaf,0,0x10);
  res = 0;
  cVar1 = *aNode;
  blobGrowBuffer(pNew,nNode,&res);
  if (res == 0) {
    pNew->n = 0;
    res = nodeReaderInit((NodeReader *)&prev.n,aNode,nNode);
    while (res == 0 && prev._8_8_ != 0) {
      if (pNew->n == 0) {
        iVar2 = fts3TermCmp((char *)reader.iChild,(int)reader.term.a,zTerm,nTerm);
        if ((-1 < iVar2) && ((cVar1 == '\0' || (iVar2 != 0)))) {
          fts3StartNode(pNew,(int)*aNode,reader._8_8_);
          *piBlock = reader._8_8_;
          goto LAB_0022a43c;
        }
      }
      else {
LAB_0022a43c:
        res = fts3AppendToNode(pNew,(Blob *)&bLeaf,(char *)reader.iChild,(int)reader.term.a,
                               (char *)reader.term._8_8_,(int)reader.aDoclist);
        if (res != 0) break;
        res = 0;
      }
      res = nodeReaderNext((NodeReader *)&prev.n);
    }
    if (pNew->n == 0) {
      fts3StartNode(pNew,(int)*aNode,reader._8_8_);
      *piBlock = reader._8_8_;
    }
    nodeReaderRelease((NodeReader *)&prev.n);
    sqlite3_free(_bLeaf);
    aNode_local._4_4_ = res;
  }
  else {
    aNode_local._4_4_ = res;
  }
  return aNode_local._4_4_;
}

Assistant:

static int fts3TruncateNode(
  const char *aNode,              /* Current node image */
  int nNode,                      /* Size of aNode in bytes */
  Blob *pNew,                     /* OUT: Write new node image here */
  const char *zTerm,              /* Omit all terms smaller than this */
  int nTerm,                      /* Size of zTerm in bytes */
  sqlite3_int64 *piBlock          /* OUT: Block number in next layer down */
){
  NodeReader reader;              /* Reader object */
  Blob prev = {0, 0, 0};          /* Previous term written to new node */
  int rc = SQLITE_OK;             /* Return code */
  int bLeaf = aNode[0]=='\0';     /* True for a leaf node */

  /* Allocate required output space */
  blobGrowBuffer(pNew, nNode, &rc);
  if( rc!=SQLITE_OK ) return rc;
  pNew->n = 0;

  /* Populate new node buffer */
  for(rc = nodeReaderInit(&reader, aNode, nNode); 
      rc==SQLITE_OK && reader.aNode; 
      rc = nodeReaderNext(&reader)
  ){
    if( pNew->n==0 ){
      int res = fts3TermCmp(reader.term.a, reader.term.n, zTerm, nTerm);
      if( res<0 || (bLeaf==0 && res==0) ) continue;
      fts3StartNode(pNew, (int)aNode[0], reader.iChild);
      *piBlock = reader.iChild;
    }
    rc = fts3AppendToNode(
        pNew, &prev, reader.term.a, reader.term.n,
        reader.aDoclist, reader.nDoclist
    );
    if( rc!=SQLITE_OK ) break;
  }
  if( pNew->n==0 ){
    fts3StartNode(pNew, (int)aNode[0], reader.iChild);
    *piBlock = reader.iChild;
  }
  assert( pNew->n<=pNew->nAlloc );

  nodeReaderRelease(&reader);
  sqlite3_free(prev.a);
  return rc;
}